

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cpp
# Opt level: O1

PointCloudColorQuantity * __thiscall
polyscope::PointCloud::addColorQuantityImpl
          (PointCloud *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *colors)

{
  pointer pcVar1;
  PointCloudColorQuantity *this_00;
  string local_48;
  
  this_00 = (PointCloudColorQuantity *)operator_new(0x88);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + name->_M_string_length);
  PointCloudColorQuantity::PointCloudColorQuantity(this_00,&local_48,colors,this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  QuantityStructure<polyscope::PointCloud>::addQuantity
            (&this->super_QuantityStructure<polyscope::PointCloud>,(QuantityType *)this_00,true);
  return this_00;
}

Assistant:

PointCloudColorQuantity* PointCloud::addColorQuantityImpl(std::string name, const std::vector<glm::vec3>& colors) {
  PointCloudColorQuantity* q = new PointCloudColorQuantity(name, colors, *this);
  addQuantity(q);
  return q;
}